

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall
fasttext::Dictionary::computeSubwords
          (Dictionary *this,string *word,vector<int,_std::allocator<int>_> *ngrams,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *substrings)

{
  bool bVar1;
  uint32_t id;
  value_type *pvVar2;
  char *pcVar3;
  value_type *pvVar4;
  element_type *peVar5;
  long in_RCX;
  ulong in_RSI;
  int32_t h;
  size_t n;
  size_t j;
  string ngram;
  size_t i;
  value_type *in_stack_ffffffffffffff48;
  Dictionary *this_00;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 uVar6;
  Dictionary *local_60;
  value_type *local_58;
  string local_48 [32];
  value_type *local_28;
  long local_20;
  ulong local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  for (local_28 = (value_type *)0x0; pvVar4 = local_28,
      pvVar2 = (value_type *)std::__cxx11::string::size(), pvVar4 < pvVar2; local_28 = local_28 + 1)
  {
    std::__cxx11::string::string(local_48);
    pcVar3 = (char *)std::__cxx11::string::operator[](local_10);
    if (((int)*pcVar3 & 0xc0U) != 0x80) {
      local_58 = local_28;
      local_60 = (Dictionary *)0x1;
      while( true ) {
        pvVar4 = (value_type *)std::__cxx11::string::size();
        bVar1 = false;
        if (local_58 < pvVar4) {
          peVar5 = std::
                   __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x19a1ad);
          bVar1 = local_60 <= (Dictionary *)(long)peVar5->maxn;
        }
        if (!bVar1) break;
        std::__cxx11::string::operator[](local_10);
        std::__cxx11::string::push_back((char)local_48);
        while( true ) {
          local_58 = local_58 + 1;
          pvVar4 = local_58;
          pvVar2 = (value_type *)std::__cxx11::string::size();
          uVar6 = false;
          if (pvVar4 < pvVar2) {
            pcVar3 = (char *)std::__cxx11::string::operator[](local_10);
            uVar6 = ((int)*pcVar3 & 0xc0U) == 0x80;
          }
          if ((bool)uVar6 == false) break;
          std::__cxx11::string::operator[](local_10);
          std::__cxx11::string::push_back((char)local_48);
        }
        this_00 = local_60;
        peVar5 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x19a2c6);
        if (((Dictionary *)(long)peVar5->minn <= this_00) &&
           ((local_60 != (Dictionary *)0x1 ||
            ((local_28 != (value_type *)0x0 &&
             (in_stack_ffffffffffffff48 = local_58,
             pvVar2 = (value_type *)std::__cxx11::string::size(),
             in_stack_ffffffffffffff48 != pvVar2)))))) {
          id = hash((Dictionary *)CONCAT17(uVar6,in_stack_ffffffffffffff60),pvVar4);
          std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x19a339);
          pushHash(this_00,(vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff48,id);
          if (local_20 != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)this_00,in_stack_ffffffffffffff48);
          }
        }
        local_60 = (Dictionary *)
                   ((long)&(local_60->args_).
                           super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
                   );
      }
    }
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void Dictionary::computeSubwords(
    const std::string& word,
    std::vector<int32_t>& ngrams,
    std::vector<std::string>* substrings) const {
  for (size_t i = 0; i < word.size(); i++) {
    std::string ngram;
    if ((word[i] & 0xC0) == 0x80) {
      continue;
    }
    for (size_t j = i, n = 1; j < word.size() && n <= args_->maxn; n++) {
      ngram.push_back(word[j++]);
      while (j < word.size() && (word[j] & 0xC0) == 0x80) {
        ngram.push_back(word[j++]);
      }
      if (n >= args_->minn && !(n == 1 && (i == 0 || j == word.size()))) {
        int32_t h = hash(ngram) % args_->bucket;
        pushHash(ngrams, h);
        if (substrings) {
          substrings->push_back(ngram);
        }
      }
    }
  }
}